

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# workitem.cpp
# Opt level: O0

void __thiscall depspawn::internal::Workitem::finish_execution(Workitem *this)

{
  int iVar1;
  __int_type_conflict _Var2;
  atomic<int> *paVar3;
  _dep *datain;
  __pointer_type in_RDI;
  bool bVar4;
  _dep *idep;
  Workitem *current;
  bool erase;
  Workitem *worklist_wait_hint;
  Workitem *p;
  anon_class_1_0_00000001 *in_stack_ffffffffffffff30;
  undefined7 in_stack_ffffffffffffff38;
  undefined1 in_stack_ffffffffffffff3f;
  LinkedListPool<depspawn::internal::arg_info,_true,_false> *in_stack_ffffffffffffff40;
  undefined5 in_stack_ffffffffffffff50;
  undefined1 uVar5;
  undefined1 in_stack_ffffffffffffff56;
  undefined1 uVar6;
  memory_order in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  _dep *in_stack_ffffffffffffff80;
  Workitem *this_00;
  __pointer_type pWVar7;
  bool local_69;
  __pointer_type local_60;
  
  paVar3 = &in_RDI->nchildren;
  LOCK();
  iVar1 = (paVar3->super___atomic_base<int>)._M_i;
  (paVar3->super___atomic_base<int>)._M_i = (paVar3->super___atomic_base<int>)._M_i + -1;
  UNLOCK();
  if (iVar1 == 1) {
    local_69 = false;
    this_00 = in_RDI;
    do {
      this_00->status = Done;
      bVar4 = local_69 == false;
      local_69 = true;
      pWVar7 = this_00;
      if ((bVar4) &&
         (in_stack_ffffffffffffff56 = false, local_69 = (bool)in_stack_ffffffffffffff56,
         ((long)this_00 >> 8 & 0xfffU) < 0x20)) {
        _Var2 = std::__atomic_base::operator_cast_to_int
                          ((__atomic_base<int> *)
                           CONCAT17(in_stack_ffffffffffffff3f,in_stack_ffffffffffffff38));
        in_stack_ffffffffffffff56 = false;
        local_69 = (bool)in_stack_ffffffffffffff56;
        pWVar7 = this_00;
        if (_Var2 == 0) {
          bVar4 = std::atomic::operator_cast_to_bool
                            ((atomic<bool> *)
                             CONCAT17(in_stack_ffffffffffffff3f,in_stack_ffffffffffffff38));
          in_stack_ffffffffffffff56 = false;
          local_69 = (bool)in_stack_ffffffffffffff56;
          pWVar7 = this_00;
          if (!bVar4) {
            in_stack_ffffffffffffff56 =
                 std::atomic<bool>::compare_exchange_weak
                           ((atomic<bool> *)this_00,(bool *)in_stack_ffffffffffffff80,
                            SUB41((uint)in_stack_ffffffffffffff7c >> 0x18,0),
                            in_stack_ffffffffffffff78);
            local_69 = (bool)in_stack_ffffffffffffff56;
            pWVar7 = this_00;
          }
        }
      }
      uVar6 = local_69;
      for (local_60 = std::atomic<depspawn::internal::Workitem_*>::load
                                ((atomic<depspawn::internal::Workitem_*> *)
                                 CONCAT17(in_stack_ffffffffffffff3f,in_stack_ffffffffffffff38),
                                 (memory_order)((ulong)in_stack_ffffffffffffff30 >> 0x20));
          uVar5 = local_60 != (__pointer_type)0x0 && local_60 != in_RDI,
          local_60 != (__pointer_type)0x0 && local_60 != in_RDI; local_60 = local_60->next) {
        do {
        } while (local_60->status == Filling);
        if ((local_60->optFlags_ & 1U) == 0) {
          if ((local_60->optFlags_ & 2U) == 0) break;
          if ((short)local_60->status < 4) {
            local_60 = local_60->father;
          }
        }
      }
      in_stack_ffffffffffffff80 = pWVar7->deps;
      if (in_stack_ffffffffffffff80 != (_dep *)0x0) {
        do {
          in_stack_ffffffffffffff40 =
               (LinkedListPool<depspawn::internal::arg_info,_true,_false> *)
               &in_stack_ffffffffffffff80->w->ndependencies;
          datain = (_dep *)0x4;
          LOCK();
          iVar1 = (((atomic<int> *)in_stack_ffffffffffffff40)->super___atomic_base<int>)._M_i;
          (((atomic<int> *)in_stack_ffffffffffffff40)->super___atomic_base<int>)._M_i =
               (((atomic<int> *)in_stack_ffffffffffffff40)->super___atomic_base<int>)._M_i + -1;
          UNLOCK();
          if (iVar1 == 1) {
            post((Workitem *)0x127008);
          }
          in_stack_ffffffffffffff80 = in_stack_ffffffffffffff80->next;
        } while (in_stack_ffffffffffffff80 != (_dep *)0x0);
        LinkedListPool<depspawn::internal::Workitem::_dep,_true,_false>::freeLinkedList
                  ((LinkedListPool<depspawn::internal::Workitem::_dep,_true,_false> *)
                   CONCAT17(uVar6,CONCAT16(in_stack_ffffffffffffff56,
                                           CONCAT15(uVar5,in_stack_ffffffffffffff50))),datain,
                   (_dep *)in_stack_ffffffffffffff40,(bool)in_stack_ffffffffffffff3f);
        pWVar7->lastdep = (_dep *)0x0;
        pWVar7->deps = (_dep *)0x0;
      }
      if (pWVar7->args != (arg_info *)0x0) {
        LinkedListPool<depspawn::internal::arg_info,true,false>::
        freeLinkedList<depspawn::internal::Workitem::finish_execution()::__0>
                  (in_stack_ffffffffffffff40,
                   (arg_info *)CONCAT17(in_stack_ffffffffffffff3f,in_stack_ffffffffffffff38),
                   in_stack_ffffffffffffff30);
        pWVar7->args = (arg_info *)0x0;
      }
      this_00 = pWVar7->father;
      pWVar7->status = Deallocatable;
      in_stack_ffffffffffffff3f = false;
      if (this_00 != (Workitem *)0x0) {
        paVar3 = &this_00->nchildren;
        in_stack_ffffffffffffff30 = (anon_class_1_0_00000001 *)0x4;
        LOCK();
        iVar1 = (paVar3->super___atomic_base<int>)._M_i;
        (paVar3->super___atomic_base<int>)._M_i = (paVar3->super___atomic_base<int>)._M_i + -1;
        UNLOCK();
        in_stack_ffffffffffffff3f = iVar1 == 1;
      }
    } while ((bool)in_stack_ffffffffffffff3f != false);
    if (local_69 != false) {
      Clean_worklist((Workitem *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    }
  }
  return;
}

Assistant:

void Workitem::finish_execution()
    { Workitem *p, *worklist_wait_hint;

      if(nchildren.fetch_sub(1) != 1)
        return;
      
      bool erase = false;
      Workitem *current = this;

      do {

        // Finish work
        current->status = Status_t::Done;
      
        /* Without this fence the change of status can be unseen by Workitems that are Filling in */
        std::atomic_thread_fence(std::memory_order_seq_cst);
      
        erase = erase || ((((((intptr_t)current)>>8)&0xfff) < 32) && !ObserversAtWork && !eraser_assigned && eraser_assigned.compare_exchange_weak(erase, true));

        worklist_wait_hint = worklist.load(std::memory_order_seq_cst);
#ifdef __arm64__
        // Make sure status is seen in insert_in_worklist upon insertion in worklist
        // See semantics of std::atomic_thread_fence
        while(!worklist.compare_exchange_weak(worklist_wait_hint, worklist_wait_hint));
#endif
        //lastkeep = worklist_wait_hint;

        for(p = worklist_wait_hint; p && p != this; p = p->next) { //wait until this, not current
      
          while(p->status == Status_t::Filling) {}
      
          //if(p->status != Deallocatable)
          //  lastkeep = p;
      
          if(!(p->optFlags_ & OptFlags::PendingFills)) {
            if(p->optFlags_ & OptFlags::FatherScape) {
              if (p->status < Status_t::Done) { //The father of a Done/Deallocated could be freed
                p = p->father; //the iterator sets p = p->next;
              }
            } else {
              break;
            }
          }
          
        }
        
        // free lists
        //delete ctx_->task;
      
        Workitem::_dep *idep = current->deps;
        if (idep != nullptr) {
          do {
            if(idep->w->ndependencies.fetch_sub(1) == 1) {
              idep->w->post();
            }
            idep = idep->next;
          } while (idep != nullptr);
          Workitem::_dep::Pool.freeLinkedList(current->deps, current->lastdep);
          current->deps = current->lastdep = nullptr;
        }

        if (current->args != nullptr) {
          arg_info::Pool.freeLinkedList(current->args, [](arg_info *i) { if(i->is_array()) delete [] i->array_range; } );
          current->args = nullptr;
        }
      
        p = current->father;
      
        current->status = Status_t::Deallocatable;
      
        current = p;

      } while ((p != nullptr) && (p->nchildren.fetch_sub(1) == 1));
      
      if(erase) {
        Clean_worklist(worklist_wait_hint);
      }
      
    }